

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O2

XXH_errorcode XXH64_reset(XXH64_state_t *state_in,unsigned_long_long seed)

{
  state_in->ll[1] = seed;
  state_in->ll[2] = seed + 0x60ea27eeadc0b5d6;
  state_in->ll[3] = seed + 0xc2b2ae3d27d4eb4f;
  state_in->ll[4] = seed;
  state_in->ll[5] = seed + 0x61c8864e7a143579;
  state_in->ll[0] = 0;
  *(undefined4 *)(state_in->ll + 6) = 0;
  return XXH_OK;
}

Assistant:

XXH_errorcode XXH64_reset(XXH64_state_t *state_in, unsigned long long seed) {
    XXH_istate64_t *state = (XXH_istate64_t *) state_in;
    state->seed = seed;
    state->v1 = seed + PRIME64_1 + PRIME64_2;
    state->v2 = seed + PRIME64_2;
    state->v3 = seed + 0;
    state->v4 = seed - PRIME64_1;
    state->total_len = 0;
    state->memsize = 0;
    return XXH_OK;
}